

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

void __thiscall
SubprocessTestNoSuchCommand::SubprocessTestNoSuchCommand(SubprocessTestNoSuchCommand *this)

{
  SubprocessTestNoSuchCommand *this_local;
  
  anon_unknown.dwarf_cd35c::SubprocessTest::SubprocessTest(&this->super_SubprocessTest);
  (this->super_SubprocessTest).super_Test._vptr_Test =
       (_func_int **)&PTR__SubprocessTestNoSuchCommand_002a8c48;
  return;
}

Assistant:

TEST_F(SubprocessTest, NoSuchCommand) {
  Subprocess* subproc = subprocs_.Add("ninja_no_such_command");
  ASSERT_NE((Subprocess *) 0, subproc);

  subprocs_.ResetTokenAvailable();
  while (!subproc->Done()) {
    // Pretend we discovered that stderr was ready for writing.
    subprocs_.DoWork(NULL);
  }
  ASSERT_FALSE(subprocs_.IsTokenAvailable());

  EXPECT_EQ(ExitFailure, subproc->Finish());
  EXPECT_NE("", subproc->GetOutput());
#ifdef _WIN32
  ASSERT_EQ("CreateProcess failed: The system cannot find the file "
            "specified.\n", subproc->GetOutput());
#endif
}